

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnishingElement::IfcFurnishingElement(IfcFurnishingElement *this)

{
  IfcFurnishingElement *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcElement).field_0x148,"IfcFurnishingElement");
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__00f6d538);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnishingElement,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnishingElement,_0UL> *)
             &(this->super_IfcElement).field_0x138,&PTR_construction_vtable_24__00f6d628);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0xf6d430;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0xf6d520;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0xf6d458;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf6d480;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0xf6d4a8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0xf6d4d0;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0xf6d4f8;
  return;
}

Assistant:

IfcFurnishingElement() : Object("IfcFurnishingElement") {}